

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

bool QtPrivate::isRightToLeft(QStringView string)

{
  long lVar1;
  long in_FS_OFFSET;
  undefined1 local_11;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (string.m_size < 1) {
    local_11 = 0;
  }
  else {
    isRightToLeft();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(local_11 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QtPrivate::isRightToLeft(QStringView string) noexcept
{
    int isolateLevel = 0;

    for (QStringIterator i(string); i.hasNext();) {
        const char32_t c = i.next();

        switch (QChar::direction(c)) {
        case QChar::DirRLI:
        case QChar::DirLRI:
        case QChar::DirFSI:
            ++isolateLevel;
            break;
        case QChar::DirPDI:
            if (isolateLevel)
                --isolateLevel;
            break;
        case QChar::DirL:
            if (isolateLevel)
                break;
            return false;
        case QChar::DirR:
        case QChar::DirAL:
            if (isolateLevel)
                break;
            return true;
        case QChar::DirEN:
        case QChar::DirES:
        case QChar::DirET:
        case QChar::DirAN:
        case QChar::DirCS:
        case QChar::DirB:
        case QChar::DirS:
        case QChar::DirWS:
        case QChar::DirON:
        case QChar::DirLRE:
        case QChar::DirLRO:
        case QChar::DirRLE:
        case QChar::DirRLO:
        case QChar::DirPDF:
        case QChar::DirNSM:
        case QChar::DirBN:
            break;
        }
    }
    return false;
}